

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O1

void __thiscall
solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
::~StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
          (StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test *this)

{
  (this->super_StockPileColliderGetUncoveredCardsPositionTests).super_StockPileColliderTests.
  super_Test._vptr_Test = (_func_int **)&PTR__StockPileColliderTests_00326488;
  (this->super_StockPileColliderGetUncoveredCardsPositionTests).super_StockPileColliderTests.
  stockPileMock.super_StockPile.super_Archiver._vptr_Archiver =
       (_func_int **)&PTR__StockPileMock_003214f0;
  testing::internal::FunctionMocker<std::optional<unsigned_int>_()>::~FunctionMocker
            (&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
              super_StockPileColliderTests.stockPileMock.gmock10_getSelectedCardIndex_17);
  testing::internal::
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::~FunctionMocker(&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                     super_StockPileColliderTests.stockPileMock.gmock10_getCards_16);
  testing::internal::FunctionMocker<std::optional<solitaire::cards::Card>_()>::~FunctionMocker
            (&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
              super_StockPileColliderTests.stockPileMock.gmock00_tryPullOutCard_15);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker
            (&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
              super_StockPileColliderTests.stockPileMock.gmock00_trySelectNextCard_14);
  testing::internal::
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::~FunctionMocker(&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                     super_StockPileColliderTests.stockPileMock.gmock00_createSnapshot_13);
  testing::internal::
  FunctionMocker<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
  ::~FunctionMocker(&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                     super_StockPileColliderTests.stockPileMock.gmock02_initialize_11);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_P(StockPileColliderGetUncoveredCardsPositionTests, getUncoveredCardsPosition) {
    const auto& uncoveredCardsPositionData = GetParam();
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(uncoveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getUncoveredCardsPosition(),
        uncoveredCardsPositionData.position
    );
}